

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintElem.hpp
# Opt level: O0

void __thiscall OpenMD::ConstraintElem::ConstraintElem(ConstraintElem *this,StuntDouble *sd)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  shared_ptr<OpenMD::GenericData> movingData;
  shared_ptr<OpenMD::GenericData> movedData;
  shared_ptr<OpenMD::SimpleTypeData<bool>_> *in_stack_fffffffffffffe88;
  shared_ptr<OpenMD::SimpleTypeData<bool>_> *__r;
  string *in_stack_fffffffffffffe90;
  shared_ptr<OpenMD::GenericData> *this_00;
  StuntDouble *in_stack_fffffffffffffe98;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffea8;
  errorStruct *peVar2;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffeb8;
  shared_ptr<OpenMD::GenericData> *genData;
  StuntDouble *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  shared_ptr<OpenMD::SimpleTypeData<bool>_> local_e0 [2];
  undefined1 local_b9 [65];
  undefined1 local_78 [56];
  string local_40 [64];
  
  *in_RDI = in_RSI;
  std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eebdd);
  std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eebf0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)(local_78 + 0x37));
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe90,
                          in_stack_fffffffffffffe88);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::SimpleTypeData<bool>,OpenMD::GenericData>
              (in_stack_fffffffffffffea8);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::operator=
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::~shared_ptr
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eecb8);
    bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)in_stack_fffffffffffffe90,
                            in_stack_fffffffffffffe88);
    if (bVar1) {
      snprintf(painCave.errMsg,2000,
               "Generic Data with keyword Moved exists, however, it can not be casted to a BoolGenericData.\n"
              );
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    std::make_shared<OpenMD::SimpleTypeData<bool>,char_const(&)[6]>
              ((char (*) [6])in_stack_fffffffffffffeb8);
    in_stack_fffffffffffffec8 = (char *)(in_RDI + 1);
    in_stack_fffffffffffffec0 = (StuntDouble *)local_78;
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::operator=
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::~shared_ptr
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eedb1);
    in_stack_fffffffffffffed0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*in_RDI;
    std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::SimpleTypeData<bool>,void>
              ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    StuntDouble::addProperty(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x1eedf3);
  }
  genData = (shared_ptr<OpenMD::GenericData> *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (allocator<char> *)in_stack_fffffffffffffec0);
  StuntDouble::getPropertyByName(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  bVar1 = std::operator!=((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffe90,
                          in_stack_fffffffffffffe88);
  if (bVar1) {
    std::dynamic_pointer_cast<OpenMD::SimpleTypeData<bool>,OpenMD::GenericData>
              (in_stack_fffffffffffffea8);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::operator=
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)in_stack_fffffffffffffe90,
               in_stack_fffffffffffffe88);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::~shared_ptr
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eeedd);
    bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)in_stack_fffffffffffffe90,
                            in_stack_fffffffffffffe88);
    if (bVar1) {
      peVar2 = &painCave;
      snprintf(painCave.errMsg,2000,
               "Generic Data with keyword Moving exists, however, it can not be casted to a BoolGenericData.\n"
              );
      peVar2->isFatal = 1;
      simError();
    }
  }
  else {
    std::make_shared<OpenMD::SimpleTypeData<bool>,char_const(&)[7]>((char (*) [7])genData);
    this_00 = (shared_ptr<OpenMD::GenericData> *)(in_RDI + 3);
    __r = local_e0;
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::operator=
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)this_00,__r);
    std::shared_ptr<OpenMD::SimpleTypeData<bool>_>::~shared_ptr
              ((shared_ptr<OpenMD::SimpleTypeData<bool>_> *)0x1eefd4);
    std::shared_ptr<OpenMD::GenericData>::shared_ptr<OpenMD::SimpleTypeData<bool>,void>(this_00,__r)
    ;
    StuntDouble::addProperty(in_stack_fffffffffffffec0,genData);
    std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x1ef016);
  }
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x1ef048);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x1ef055);
  return;
}

Assistant:

ConstraintElem(StuntDouble* sd) : sd_(sd) {
      std::shared_ptr<GenericData> movedData = sd_->getPropertyByName("Moved");
      if (movedData != nullptr) {  // if generic data with keyword "moved"
                                   // exists, assign it to moved_
        moved_ = std::dynamic_pointer_cast<BoolGenericData>(movedData);
        if (moved_ == nullptr) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "Generic Data with keyword Moved exists, however, it can not "
              "be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {  // if generic data with keyword "moved" does not exist, create
                // it
        moved_ = std::make_shared<BoolGenericData>("Moved");
        sd_->addProperty(moved_);
      }

      std::shared_ptr<GenericData> movingData =
          sd_->getPropertyByName("Moving");
      if (movingData != nullptr) {
        moving_ = std::dynamic_pointer_cast<BoolGenericData>(movingData);
        if (moving_ == nullptr) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Generic Data with keyword Moving exists, however, it can "
                   "not be casted to a BoolGenericData.\n");
          painCave.isFatal = 1;
          ;
          simError();
        }
      } else {
        moving_ = std::make_shared<BoolGenericData>("Moving");
        sd_->addProperty(moving_);
      }
    }